

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

DTLSOutgoingMessage * __thiscall
bssl::InplaceVector<bssl::DTLSOutgoingMessage,_7UL>::TryPushBack
          (InplaceVector<bssl::DTLSOutgoingMessage,_7UL> *this,DTLSOutgoingMessage *val)

{
  size_t sVar1;
  size_t sVar2;
  DTLSOutgoingMessage *pDVar3;
  DTLSOutgoingMessage *ret;
  DTLSOutgoingMessage *val_local;
  InplaceVector<bssl::DTLSOutgoingMessage,_7UL> *this_local;
  
  sVar1 = size(this);
  sVar2 = capacity();
  if (sVar1 < sVar2) {
    pDVar3 = data(this);
    this_local = (InplaceVector<bssl::DTLSOutgoingMessage,_7UL> *)(pDVar3 + this->size_);
    DTLSOutgoingMessage::DTLSOutgoingMessage((DTLSOutgoingMessage *)this_local,val);
    this->size_ = this->size_ + '\x01';
  }
  else {
    this_local = (InplaceVector<bssl::DTLSOutgoingMessage,_7UL> *)0x0;
  }
  return (DTLSOutgoingMessage *)this_local;
}

Assistant:

[[nodiscard]] T *TryPushBack(T val) {
    if (size() >= capacity()) {
      return nullptr;
    }
    T *ret = &data()[size_];
    new (ret) T(std::move(val));
    size_++;
    return ret;
  }